

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_validate_utf8_chunk(nn_sws *self)

{
  int iVar1;
  long in_RDI;
  size_t len;
  char *in_stack_00000010;
  int code_point_len;
  uint8_t *pos;
  uint8_t *in_stack_ffffffffffffffd8;
  ulong local_20;
  undefined1 *local_10;
  
  local_20 = *(ulong *)(in_RDI + 0x1688);
  local_10 = *(undefined1 **)(in_RDI + 0x1680);
  if (*(long *)(in_RDI + 0x1658) == 0) {
LAB_00149c7c:
    if (3 < *(ulong *)(in_RDI + 0x1658)) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x27a);
      fflush(_stderr);
      nn_err_abort();
    }
    do {
      while( true ) {
        if (local_20 == 0) {
          *(undefined8 *)(in_RDI + 0x1658) = 0;
          memset((void *)(in_RDI + 0x1654),0,4);
          if (*(int *)(in_RDI + 0x1648) != 0) {
            *(undefined4 *)(in_RDI + 0x1620) = 4;
            nn_pipebase_received((nn_pipebase *)0x149f68);
            return;
          }
          nn_sws_recv_hdr((nn_sws *)0x149f74);
          return;
        }
        iVar1 = nn_utf8_code_point(in_stack_ffffffffffffffd8,0x149cef);
        if (iVar1 < 1) break;
        if (local_20 < (ulong)(long)iVar1) {
          nn_backtrace_print();
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","len >= (size_t) code_point_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                  ,0x281);
          fflush(_stderr);
          nn_err_abort();
        }
        local_20 = local_20 - (long)iVar1;
        local_10 = local_10 + iVar1;
      }
      if (iVar1 == -2) {
        *(undefined8 *)(in_RDI + 0x1658) = 0;
        memset((void *)(in_RDI + 0x1654),0,4);
        nn_sws_fail_conn(self,pos._4_4_,in_stack_00000010);
        return;
      }
    } while (iVar1 != -1);
    if (3 < local_20) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","len < NN_SWS_UTF8_MAX_CODEPOINT_LEN",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x28f);
      fflush(_stderr);
      nn_err_abort();
    }
    *(ulong *)(in_RDI + 0x1658) = local_20;
    memcpy((void *)(in_RDI + 0x1654),local_10,local_20);
    if (*(int *)(in_RDI + 0x1648) == 0) {
      nn_sws_recv_hdr((nn_sws *)0x149ea3);
    }
    else {
      nn_sws_fail_conn(self,pos._4_4_,in_stack_00000010);
    }
  }
  else {
    if (3 < *(ulong *)(in_RDI + 0x1658)) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "self->utf8_code_pt_fragment_len < NN_SWS_UTF8_MAX_CODEPOINT_LEN",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x254);
      fflush(_stderr);
      nn_err_abort();
    }
    do {
      if (local_20 == 0) goto LAB_00149c7c;
      *(undefined1 *)(in_RDI + 0x1654 + *(long *)(in_RDI + 0x1658)) = *local_10;
      *(long *)(in_RDI + 0x1658) = *(long *)(in_RDI + 0x1658) + 1;
      local_10 = local_10 + 1;
      local_20 = local_20 - 1;
      iVar1 = nn_utf8_code_point(in_stack_ffffffffffffffd8,0x149c03);
      if (0 < iVar1) goto LAB_00149c7c;
      if (iVar1 == -2) {
        nn_sws_fail_conn(self,pos._4_4_,in_stack_00000010);
        return;
      }
    } while (iVar1 != -1);
    if (*(int *)(in_RDI + 0x1648) == 0) {
      nn_sws_recv_hdr((nn_sws *)0x149c6c);
    }
    else {
      nn_sws_fail_conn(self,pos._4_4_,in_stack_00000010);
    }
  }
  return;
}

Assistant:

static void nn_sws_validate_utf8_chunk (struct nn_sws *self)
{
    uint8_t *pos;
    int code_point_len;
    size_t len;

    len = self->inmsg_current_chunk_len;
    pos = self->inmsg_current_chunk_buf;

    /*  For chunked transfers, it's possible that a previous chunk was cut
        intra-code point. That partially-validated code point is reassembled
        with the beginning of the current chunk and checked. */
    if (self->utf8_code_pt_fragment_len) {

        nn_assert (self->utf8_code_pt_fragment_len <
            NN_SWS_UTF8_MAX_CODEPOINT_LEN);

        /*  Keep adding octets from fresh buffer to previous code point
            fragment to check for validity. */
        while (len > 0) {
            self->utf8_code_pt_fragment [self->utf8_code_pt_fragment_len] = *pos;
            self->utf8_code_pt_fragment_len++;
            pos++;
            len--;

            code_point_len = nn_utf8_code_point (self->utf8_code_pt_fragment,
                self->utf8_code_pt_fragment_len);

            if (code_point_len > 0) {
                /*  Valid code point found; continue validating. */
                break;
            }
            else if (code_point_len == NN_SWS_UTF8_INVALID) {
                nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                    "Invalid UTF-8 code point split on previous frame.");
                return;
            }
            else if (code_point_len == NN_SWS_UTF8_FRAGMENT) {
                if (self->is_final_frame) {
                    nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                        "Truncated UTF-8 payload with invalid code point.");
                    return;
                }
                else {
                    /*  This chunk is well-formed; now recv the next chunk. */
                    nn_sws_recv_hdr (self);
                    return;
                }
            }
        }
    }

    if (self->utf8_code_pt_fragment_len >= NN_SWS_UTF8_MAX_CODEPOINT_LEN)
        nn_assert (0);

    while (len > 0) {
        code_point_len = nn_utf8_code_point (pos, len);

        if (code_point_len > 0) {
            /*  Valid code point found; continue validating. */
            nn_assert (len >= (size_t) code_point_len);
            len -= code_point_len;
            pos += code_point_len;
            continue;
        }
        else if (code_point_len == NN_SWS_UTF8_INVALID) {
            self->utf8_code_pt_fragment_len = 0;
            memset (self->utf8_code_pt_fragment, 0,
                NN_SWS_UTF8_MAX_CODEPOINT_LEN);
            nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                "Invalid UTF-8 code point in payload.");
            return;
        }
        else if (code_point_len == NN_SWS_UTF8_FRAGMENT) {
            nn_assert (len < NN_SWS_UTF8_MAX_CODEPOINT_LEN);
            self->utf8_code_pt_fragment_len = len;
            memcpy (self->utf8_code_pt_fragment, pos, len);
            if (self->is_final_frame) {
                nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                    "Truncated UTF-8 payload with invalid code point.");
            }
            else {
                /*  Previous frame ended in the middle of a code point;
                    receive more. */
                nn_sws_recv_hdr (self);
            }
            return;
        }
    }

    /*  Entire buffer is well-formed. */
    nn_assert (len == 0);

    self->utf8_code_pt_fragment_len = 0;
    memset (self->utf8_code_pt_fragment, 0, NN_SWS_UTF8_MAX_CODEPOINT_LEN);

    if (self->is_final_frame) {
        self->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
        nn_pipebase_received (&self->pipebase);
    }
    else {
        nn_sws_recv_hdr (self);
    }

    return;
}